

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.cpp
# Opt level: O2

bool std::operator==(set<char,_std::less<char>,_std::allocator<char>_> *s,
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l)

{
  pointer pcVar1;
  pair<std::_Rb_tree_const_iterator<char>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar2;
  _Rb_tree_header *p_Var3;
  pair<std::_Rb_tree_const_iterator<char>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar4;
  
  p_Var3 = &(s->_M_t)._M_impl.super__Rb_tree_header;
  pcVar1 = (l->_M_dataplus)._M_p;
  pVar4 = __mismatch<std::_Rb_tree_const_iterator<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((s->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var3,pcVar1,
                     pcVar1 + l->_M_string_length);
  pVar2.second._M_current = (l->_M_dataplus)._M_p + l->_M_string_length;
  pVar2.first._M_node = &p_Var3->_M_header;
  return pVar4 == pVar2;
}

Assistant:

bool operator == (const std::set<T, C, A> & s, const Coll & l)
    {
        return std::mismatch(s.begin(), s.end(), l.begin(), l.end()) == std::make_pair(s.end(), l.end());
    }